

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O0

void jpeg_idct_5x5(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined1 *puVar5;
  long lVar6;
  long lVar7;
  long in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  ISLOW_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  JLONG z3;
  JLONG z2;
  JLONG z1;
  JLONG tmp12;
  JLONG tmp11;
  JLONG tmp10;
  JLONG tmp1;
  JLONG tmp0;
  undefined4 local_f8 [5];
  undefined4 local_e4 [5];
  undefined4 local_d0 [5];
  undefined4 local_bc [5];
  undefined4 local_a8 [5];
  int local_94;
  long local_90;
  int workspace [25];
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  
  local_90 = *(long *)(in_RDI + 0x1a8) + 0x80;
  workspace._8_8_ = *(undefined8 *)(in_RSI + 0x58);
  workspace._0_8_ = local_f8;
  workspace._16_8_ = in_RDX;
  workspace[0x17] = in_R8D;
  unique0x100000b6 = in_RCX;
  for (local_94 = 0; local_94 < 5; local_94 = local_94 + 1) {
    lVar1 = (long)((int)*(short *)workspace._16_8_ * (int)*(short *)workspace._8_8_) * 0x2000 +
            0x400;
    lVar2 = (long)((int)*(short *)(workspace._16_8_ + 0x20) *
                  (int)*(short *)(workspace._8_8_ + 0x20));
    lVar3 = (long)((int)*(short *)(workspace._16_8_ + 0x40) *
                  (int)*(short *)(workspace._8_8_ + 0x40));
    lVar4 = lVar2 + lVar3;
    lVar2 = lVar2 - lVar3;
    lVar3 = lVar1 + lVar2 * 0xb50;
    workspace._64_8_ = lVar3 + lVar4 * 0x194c;
    workspace._56_8_ = lVar3 + lVar4 * -0x194c;
    workspace._48_8_ = lVar1 + lVar2 * -0x2d40;
    lVar1 = (long)((int)*(short *)(workspace._16_8_ + 0x10) *
                  (int)*(short *)(workspace._8_8_ + 0x10));
    lVar3 = (long)((int)*(short *)(workspace._16_8_ + 0x30) *
                  (int)*(short *)(workspace._8_8_ + 0x30));
    lVar4 = (lVar1 + lVar3) * 0x1a9a;
    workspace._80_8_ = lVar4 + lVar1 * 0x1071;
    workspace._72_8_ = lVar4 + lVar3 * -0x45a4;
    *(int *)workspace._0_8_ = (int)((long)(workspace._64_8_ + workspace._80_8_) >> 0xb);
    *(int *)(workspace._0_8_ + 0x50) = (int)((long)(workspace._64_8_ - workspace._80_8_) >> 0xb);
    *(int *)(workspace._0_8_ + 0x14) = (int)((long)(workspace._56_8_ + workspace._72_8_) >> 0xb);
    *(int *)(workspace._0_8_ + 0x3c) = (int)((long)(workspace._56_8_ - workspace._72_8_) >> 0xb);
    *(int *)(workspace._0_8_ + 0x28) = (int)((long)workspace._48_8_ >> 0xb);
    workspace._16_8_ = workspace._16_8_ + 2;
    workspace._8_8_ = workspace._8_8_ + 2;
    workspace._0_8_ = workspace._0_8_ + 4;
  }
  workspace._0_8_ = local_f8;
  for (local_94 = 0; local_94 < 5; local_94 = local_94 + 1) {
    puVar5 = (undefined1 *)
             (*(long *)(stack0xffffffffffffffe0 + (long)local_94 * 8) + (ulong)(uint)workspace[0x17]
             );
    lVar1 = ((long)*(int *)workspace._0_8_ + 0x10) * 0x2000;
    lVar3 = (long)*(int *)(workspace._0_8_ + 8) + (long)*(int *)(workspace._0_8_ + 0x10);
    lVar4 = (long)*(int *)(workspace._0_8_ + 8) - (long)*(int *)(workspace._0_8_ + 0x10);
    lVar6 = lVar1 + lVar4 * 0xb50;
    lVar2 = lVar6 + lVar3 * 0x194c;
    lVar6 = lVar6 + lVar3 * -0x194c;
    lVar7 = ((long)*(int *)(workspace._0_8_ + 4) + (long)*(int *)(workspace._0_8_ + 0xc)) * 0x1a9a;
    lVar3 = lVar7 + (long)*(int *)(workspace._0_8_ + 4) * 0x1071;
    lVar7 = lVar7 + (long)*(int *)(workspace._0_8_ + 0xc) * -0x45a4;
    *puVar5 = *(undefined1 *)(local_90 + (int)((uint)(lVar2 + lVar3 >> 0x12) & 0x3ff));
    puVar5[4] = *(undefined1 *)(local_90 + (int)((uint)(lVar2 - lVar3 >> 0x12) & 0x3ff));
    puVar5[1] = *(undefined1 *)(local_90 + (int)((uint)(lVar6 + lVar7 >> 0x12) & 0x3ff));
    puVar5[3] = *(undefined1 *)(local_90 + (int)((uint)(lVar6 - lVar7 >> 0x12) & 0x3ff));
    puVar5[2] = *(undefined1 *)(local_90 + (int)((uint)(lVar1 + lVar4 * -0x2d40 >> 0x12) & 0x3ff));
    workspace._0_8_ = workspace._0_8_ + 0x14;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_5x5(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JCOEFPTR coef_block, JSAMPARRAY output_buf,
              JDIMENSION output_col)
{
  JLONG tmp0, tmp1, tmp10, tmp11, tmp12;
  JLONG z1, z2, z3;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[5 * 5];         /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 5; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp12 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp12 = LEFT_SHIFT(tmp12, CONST_BITS);
    /* Add fudge factor here for final descale. */
    tmp12 += ONE << (CONST_BITS - PASS1_BITS - 1);
    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z1 = MULTIPLY(tmp0 + tmp1, FIX(0.790569415)); /* (c2+c4)/2 */
    z2 = MULTIPLY(tmp0 - tmp1, FIX(0.353553391)); /* (c2-c4)/2 */
    z3 = tmp12 + z2;
    tmp10 = z3 + z1;
    tmp11 = z3 - z1;
    tmp12 -= LEFT_SHIFT(z2, 2);

    /* Odd part */

    z2 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);

    z1 = MULTIPLY(z2 + z3, FIX(0.831253876));     /* c3 */
    tmp0 = z1 + MULTIPLY(z2, FIX(0.513743148));   /* c1-c3 */
    tmp1 = z1 - MULTIPLY(z3, FIX(2.176250899));   /* c1+c3 */

    /* Final output stage */

    wsptr[5 * 0] = (int)RIGHT_SHIFT(tmp10 + tmp0, CONST_BITS - PASS1_BITS);
    wsptr[5 * 4] = (int)RIGHT_SHIFT(tmp10 - tmp0, CONST_BITS - PASS1_BITS);
    wsptr[5 * 1] = (int)RIGHT_SHIFT(tmp11 + tmp1, CONST_BITS - PASS1_BITS);
    wsptr[5 * 3] = (int)RIGHT_SHIFT(tmp11 - tmp1, CONST_BITS - PASS1_BITS);
    wsptr[5 * 2] = (int)RIGHT_SHIFT(tmp12, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 5 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 5; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp12 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    tmp12 = LEFT_SHIFT(tmp12, CONST_BITS);
    tmp0 = (JLONG)wsptr[2];
    tmp1 = (JLONG)wsptr[4];
    z1 = MULTIPLY(tmp0 + tmp1, FIX(0.790569415)); /* (c2+c4)/2 */
    z2 = MULTIPLY(tmp0 - tmp1, FIX(0.353553391)); /* (c2-c4)/2 */
    z3 = tmp12 + z2;
    tmp10 = z3 + z1;
    tmp11 = z3 - z1;
    tmp12 -= LEFT_SHIFT(z2, 2);

    /* Odd part */

    z2 = (JLONG)wsptr[1];
    z3 = (JLONG)wsptr[3];

    z1 = MULTIPLY(z2 + z3, FIX(0.831253876));     /* c3 */
    tmp0 = z1 + MULTIPLY(z2, FIX(0.513743148));   /* c1-c3 */
    tmp1 = z1 - MULTIPLY(z3, FIX(2.176250899));   /* c1+c3 */

    /* Final output stage */

    outptr[0] = range_limit[(int)RIGHT_SHIFT(tmp10 + tmp0,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[4] = range_limit[(int)RIGHT_SHIFT(tmp10 - tmp0,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)RIGHT_SHIFT(tmp11 + tmp1,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[3] = range_limit[(int)RIGHT_SHIFT(tmp11 - tmp1,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)RIGHT_SHIFT(tmp12,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];

    wsptr += 5;         /* advance pointer to next row */
  }
}